

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O2

void cycle(uint64_t error,int start,int depth,uint64_t codeword)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  uint64_t uVar6;
  syndrome_struct *psVar7;
  UT_hash_table *pUVar8;
  syndrome_struct *psVar9;
  UT_hash_bucket *pUVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  UT_hash_handle *pUVar18;
  ulong uVar19;
  int iVar20;
  
  uVar19 = (ulong)(uint)start;
  do {
    iVar20 = (int)uVar19;
    if (0x39 < iVar20) {
      return;
    }
    uVar19 = error | 1L << (uVar19 & 0x3f);
    if (depth + -1 == 0) {
      uVar6 = gen_syndrome(uVar19 ^ 0xcc7b7268ff614e1b);
      psVar7 = (syndrome_struct *)malloc(0x48);
      psVar7->syndrome = uVar6;
      psVar7->error = uVar19;
      pUVar1 = &psVar7->hh;
      (psVar7->hh).next = (void *)0x0;
      (psVar7->hh).key = psVar7;
      (psVar7->hh).keylen = 8;
      psVar9 = syndrome_map;
      if (syndrome_map == (syndrome_struct *)0x0) {
        syndrome_map = psVar7;
        (psVar7->hh).prev = (void *)0x0;
        pUVar8 = (UT_hash_table *)calloc(1,0x40);
        (psVar7->hh).tbl = pUVar8;
        if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00105024;
        pUVar8->tail = pUVar1;
        pUVar8->num_buckets = 0x20;
        pUVar8->log2_num_buckets = 5;
        pUVar8->hho = 0x10;
        pUVar10 = (UT_hash_bucket *)calloc(1,0x200);
        pUVar8->buckets = pUVar10;
        if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_00105024;
        pUVar8->signature = 0xa0111fe1;
        psVar9 = psVar7;
      }
      else {
        pUVar8 = (syndrome_map->hh).tbl;
        pUVar18 = pUVar8->tail;
        pUVar18->next = psVar7;
        (psVar7->hh).prev = (void *)((long)pUVar18 - pUVar8->hho);
        pUVar8->tail = pUVar1;
      }
      uVar15 = pUVar8->num_items + 1;
      pUVar8->num_items = uVar15;
      (psVar7->hh).tbl = pUVar8;
      iVar11 = *(int *)((long)&psVar7->syndrome + 4) + -0x61c88647;
      uVar16 = (uint)(byte)psVar7->syndrome +
               ((uint)*(byte *)((long)&psVar7->syndrome + 3) * 0x1000000 - iVar11) +
               (uint)*(byte *)((long)&psVar7->syndrome + 1) * 0x100 +
               (uint)*(byte *)((long)&psVar7->syndrome + 2) * 0x10000 + 0x9f49bac2 ^ 0x7f76d;
      uVar13 = uVar16 << 8 ^ (iVar11 - uVar16) + 0x1124109;
      uVar12 = uVar13 >> 0xd ^ (-0x1124109 - uVar16) - uVar13;
      uVar16 = uVar12 >> 0xc ^ (uVar16 - uVar13) - uVar12;
      uVar17 = uVar16 << 0x10 ^ (uVar13 - uVar12) - uVar16;
      uVar13 = uVar17 >> 5 ^ (uVar12 - uVar16) - uVar17;
      uVar12 = uVar13 >> 3 ^ (uVar16 - uVar17) - uVar13;
      uVar16 = uVar12 << 10 ^ (uVar17 - uVar13) - uVar12;
      uVar12 = uVar16 >> 0xf ^ uVar13 - (uVar12 + uVar16);
      (psVar7->hh).hashv = uVar12;
      pUVar3 = (psVar9->hh).tbl;
      uVar12 = pUVar3->num_buckets - 1 & uVar12;
      pUVar10 = pUVar3->buckets;
      uVar13 = pUVar10[uVar12].count + 1;
      pUVar10[uVar12].count = uVar13;
      pUVar18 = pUVar10[uVar12].hh_head;
      (psVar7->hh).hh_next = pUVar18;
      (psVar7->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar18 != (UT_hash_handle *)0x0) {
        pUVar18->hh_prev = pUVar1;
      }
      codeword = (uint64_t)(pUVar10 + uVar12);
      ((UT_hash_bucket *)codeword)->hh_head = pUVar1;
      if ((((UT_hash_bucket *)codeword)->expand_mult * 10 + 10 <= uVar13) && (pUVar8->noexpand != 1)
         ) {
        uVar12 = pUVar8->num_buckets;
        uVar13 = uVar12 * 2;
        pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)uVar13 << 4);
        if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_00105024:
          exit(-1);
        }
        uVar13 = uVar13 - 1;
        uVar16 = ((uVar15 >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar13 & uVar15) == 0);
        pUVar8->ideal_chain_maxlen = uVar16;
        pUVar8->nonideal_items = 0;
        __ptr = pUVar8->buckets;
        uVar15 = 0;
        for (uVar19 = 0; uVar19 != uVar12; uVar19 = uVar19 + 1) {
          pUVar18 = __ptr[uVar19].hh_head;
          while (pUVar18 != (UT_hash_handle *)0x0) {
            pUVar4 = pUVar18->hh_next;
            uVar14 = pUVar18->hashv & uVar13;
            pUVar2 = pUVar10 + uVar14;
            uVar17 = pUVar10[uVar14].count + 1;
            pUVar10[uVar14].count = uVar17;
            if (uVar16 < uVar17) {
              uVar15 = uVar15 + 1;
              pUVar8->nonideal_items = uVar15;
              pUVar2->expand_mult = uVar17 / uVar16;
            }
            pUVar18->hh_prev = (UT_hash_handle *)0x0;
            pUVar5 = pUVar2->hh_head;
            pUVar18->hh_next = pUVar5;
            if (pUVar5 != (UT_hash_handle *)0x0) {
              pUVar5->hh_prev = pUVar18;
            }
            pUVar2->hh_head = pUVar18;
            pUVar18 = pUVar4;
          }
        }
        free(__ptr);
        pUVar8 = pUVar1->tbl;
        pUVar8->num_buckets = pUVar8->num_buckets << 1;
        pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
        pUVar8->buckets = pUVar10;
        uVar12 = pUVar8->num_items >> 1;
        codeword = (uint64_t)uVar12;
        if (uVar12 < pUVar8->nonideal_items) {
          uVar12 = pUVar8->ineff_expands + 1;
          codeword = (uint64_t)uVar12;
          pUVar8->ineff_expands = uVar12;
          if (1 < uVar12) {
            pUVar8->noexpand = 1;
          }
        }
        else {
          pUVar8->ineff_expands = 0;
        }
      }
    }
    else {
      cycle(uVar19,iVar20 + 1,depth + -1,codeword);
    }
    uVar19 = (ulong)(iVar20 + 1);
  } while( true );
}

Assistant:

static void cycle(uint64_t error, int start, int depth, uint64_t codeword)
{
	uint64_t new_error, syndrome, base;
	int i;
	base = 1;
	depth -= 1;
	for (i = start; i < 58; i++)
	{
		new_error = (base << i);
		new_error |= error;
		if (depth)
			cycle(new_error, i + 1, depth, codeword);
		else {
			syndrome = gen_syndrome(codeword ^ new_error);
			add_syndrome(syndrome, new_error);
		}
	}
}